

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytri.cpp
# Opt level: O1

bool lineIntersectsTriangle(float *rayStart,float *rayEnd,float *p1,float *p2,float *p3,float *sect)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  float t;
  float dir [3];
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  
  fVar1 = *rayEnd - *rayStart;
  fVar2 = rayEnd[1] - rayStart[1];
  fVar3 = rayEnd[2] - rayStart[2];
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar2)),ZEXT416((uint)fVar1),ZEXT416((uint)fVar1))
  ;
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
  if (auVar4._0_4_ < 0.0) {
    local_34 = fVar1;
    local_30 = fVar2;
    local_2c = fVar3;
    fVar6 = sqrtf(auVar4._0_4_);
  }
  else {
    auVar4 = vsqrtss_avx(auVar4,auVar4);
    fVar6 = auVar4._0_4_;
  }
  fVar7 = 1.0 / fVar6;
  local_34 = fVar1 * fVar7;
  local_30 = fVar2 * fVar7;
  local_2c = fVar3 * fVar7;
  bVar5 = rayIntersectsTriangle(rayStart,&local_34,p1,p2,p3,&local_38);
  if (bVar5) {
    if (local_38 <= fVar6) {
      bVar5 = false;
    }
    else {
      auVar8 = ZEXT416((uint)local_38);
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 * fVar7)),auVar8,ZEXT416((uint)*rayStart));
      *sect = auVar4._0_4_;
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)(fVar2 * fVar7)),auVar8,ZEXT416((uint)rayStart[1]));
      sect[1] = auVar4._0_4_;
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)(fVar3 * fVar7)),auVar8,ZEXT416((uint)rayStart[2]));
      sect[2] = auVar4._0_4_;
    }
  }
  return bVar5;
}

Assistant:

bool lineIntersectsTriangle(const float *rayStart,const float *rayEnd,const float *p1,const float *p2,const float *p3,float *sect)
{
	float dir[3];

  dir[0] = rayEnd[0] - rayStart[0];
  dir[1] = rayEnd[1] - rayStart[1];
  dir[2] = rayEnd[2] - rayStart[2];

  float d = sqrtf(dir[0]*dir[0] + dir[1]*dir[1] + dir[2]*dir[2]);
  float r = 1.0f / d;

  dir[0]*=r;
  dir[1]*=r;
  dir[2]*=r;


  float t;

	bool ret = rayIntersectsTriangle(rayStart, dir, p1, p2, p3, t );

	if ( ret )
	{
		if ( t > d )
		{
			sect[0] = rayStart[0] + dir[0]*t;
			sect[1] = rayStart[1] + dir[1]*t;
			sect[2] = rayStart[2] + dir[2]*t;
		}
		else
		{
			ret = false;
		}
	}

  return ret;
}